

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O2

void ZopfliLZ77Greedy(ZopfliBlockState *s,uchar *in,size_t instart,size_t inend,
                     ZopfliLZ77Store *store,ZopfliHash *h)

{
  unsigned_short length;
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  size_t pos;
  ulong uVar5;
  unsigned_short leng;
  unsigned_short dist;
  uint local_254;
  uint local_250;
  uint local_24c;
  ZopfliLZ77Store *local_248;
  ZopfliBlockState *local_240;
  unsigned_short dummysublen [259];
  
  if (instart != inend) {
    pos = 0;
    if (0x7fff < instart) {
      pos = instart - 0x8000;
    }
    local_248 = store;
    local_240 = s;
    ZopfliResetHash(0x8000,h);
    ZopfliWarmupHash(in,pos,inend,h);
    for (; pos < instart; pos = pos + 1) {
      ZopfliUpdateHash(in,pos,inend,h);
    }
    local_24c = 0;
    local_250 = 0;
    local_254 = 0;
    for (; instart < inend; instart = instart + 1) {
      ZopfliUpdateHash(in,instart,inend,h);
      ZopfliFindLongestMatch(local_240,h,in,instart,inend,0x102,dummysublen,&dist,&leng);
      length = leng;
      uVar1 = (uint)leng;
      iVar3 = (uVar1 - 1) + (uint)(dist < 0x401);
      uVar4 = (uint)dist;
      if (local_254 == 0) {
LAB_001216df:
        if (iVar3 < 3 || 0x101 < length) {
          if (iVar3 < 3) {
            leng = 1;
            ZopfliStoreLitLenDist((ushort)in[instart],0,instart,local_248);
            uVar2 = 1;
            uVar5 = uVar2;
          }
          else {
            ZopfliStoreLitLenDist(length,(unsigned_short)uVar4,instart,local_248);
            uVar2 = 1;
            uVar5 = (ulong)uVar1;
          }
          for (; uVar2 < uVar5; uVar2 = uVar2 + 1) {
            ZopfliUpdateHash(in,instart + uVar2,inend,h);
          }
          instart = (instart + uVar2) - 1;
          goto LAB_001217b3;
        }
        local_254 = 1;
        local_250 = uVar4;
        local_24c = uVar1;
      }
      else {
        if ((int)((local_24c - (0x400 < (int)local_250)) + 1) < iVar3) {
          local_254 = (uint)dist;
          ZopfliStoreLitLenDist((ushort)in[instart - 1],0,instart - 1,local_248);
          uVar4 = local_254;
          goto LAB_001216df;
        }
        leng = (unsigned_short)local_24c;
        dist = (unsigned_short)local_250;
        uVar4 = local_24c & 0xffff;
        ZopfliStoreLitLenDist(leng,dist,instart - 1,local_248);
        for (uVar2 = 2; uVar2 < uVar4; uVar2 = uVar2 + 1) {
          ZopfliUpdateHash(in,(instart + uVar2) - 1,inend,h);
        }
        instart = (instart + uVar2) - 2;
LAB_001217b3:
        local_254 = 0;
      }
    }
  }
  return;
}

Assistant:

void ZopfliLZ77Greedy(ZopfliBlockState* s, const unsigned char* in,
                      size_t instart, size_t inend,
                      ZopfliLZ77Store* store, ZopfliHash* h) {
  size_t i = 0, j;
  unsigned short leng;
  unsigned short dist;
  int lengthscore;
  size_t windowstart = instart > ZOPFLI_WINDOW_SIZE
      ? instart - ZOPFLI_WINDOW_SIZE : 0;
  unsigned short dummysublen[259];

#ifdef ZOPFLI_LAZY_MATCHING
  /* Lazy matching. */
  unsigned prev_length = 0;
  unsigned prev_match = 0;
  int prevlengthscore;
  int match_available = 0;
#endif

  if (instart == inend) return;

  ZopfliResetHash(ZOPFLI_WINDOW_SIZE, h);
  ZopfliWarmupHash(in, windowstart, inend, h);
  for (i = windowstart; i < instart; i++) {
    ZopfliUpdateHash(in, i, inend, h);
  }

  for (i = instart; i < inend; i++) {
    ZopfliUpdateHash(in, i, inend, h);

    ZopfliFindLongestMatch(s, h, in, i, inend, ZOPFLI_MAX_MATCH, dummysublen,
                           &dist, &leng);
    lengthscore = GetLengthScore(leng, dist);

#ifdef ZOPFLI_LAZY_MATCHING
    /* Lazy matching. */
    prevlengthscore = GetLengthScore(prev_length, prev_match);
    if (match_available) {
      match_available = 0;
      if (lengthscore > prevlengthscore + 1) {
        ZopfliStoreLitLenDist(in[i - 1], 0, i - 1, store);
        if (lengthscore >= ZOPFLI_MIN_MATCH && leng < ZOPFLI_MAX_MATCH) {
          match_available = 1;
          prev_length = leng;
          prev_match = dist;
          continue;
        }
      } else {
        /* Add previous to output. */
        leng = prev_length;
        dist = prev_match;
        lengthscore = prevlengthscore;
        /* Add to output. */
        ZopfliVerifyLenDist(in, inend, i - 1, dist, leng);
        ZopfliStoreLitLenDist(leng, dist, i - 1, store);
        for (j = 2; j < leng; j++) {
          assert(i < inend);
          i++;
          ZopfliUpdateHash(in, i, inend, h);
        }
        continue;
      }
    }
    else if (lengthscore >= ZOPFLI_MIN_MATCH && leng < ZOPFLI_MAX_MATCH) {
      match_available = 1;
      prev_length = leng;
      prev_match = dist;
      continue;
    }
    /* End of lazy matching. */
#endif

    /* Add to output. */
    if (lengthscore >= ZOPFLI_MIN_MATCH) {
      ZopfliVerifyLenDist(in, inend, i, dist, leng);
      ZopfliStoreLitLenDist(leng, dist, i, store);
    } else {
      leng = 1;
      ZopfliStoreLitLenDist(in[i], 0, i, store);
    }
    for (j = 1; j < leng; j++) {
      assert(i < inend);
      i++;
      ZopfliUpdateHash(in, i, inend, h);
    }
  }
}